

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O3

void __thiscall Inline::CloneCallSequence(Inline *this,Instr *callInstr,Instr *clonedCallInstr)

{
  OpCode opcode;
  _func_int **pp_Var1;
  SymTable *this_00;
  Func *pFVar2;
  code *pcVar3;
  OpndKind OVar4;
  bool bVar5;
  byte bVar6;
  ArgSlot argSlotNum;
  uint uVar7;
  StackSym *pSVar8;
  undefined4 *puVar9;
  SymOpnd *dstOpnd;
  Instr *this_01;
  Opnd *pOVar10;
  Instr *pIVar11;
  uint uVar12;
  Instr *pIVar13;
  Instr *pIVar14;
  Instr *local_38;
  
  pSVar8 = IR::Opnd::GetStackSym(callInstr->m_src2);
  pIVar11 = (pSVar8->field_5).m_instrDef;
  if ((pIVar11 != (Instr *)0x0 & pSVar8->field_0x18) == 1) {
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                       ,0x1af,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
    if (!bVar5) goto LAB_00548068;
    *puVar9 = 0;
    pIVar11 = (pSVar8->field_5).m_instrDef;
  }
  pIVar13 = (Instr *)0x0;
  local_38 = clonedCallInstr;
  do {
    if ((pIVar11->m_src2 == (Opnd *)0x0) ||
       (OVar4 = IR::Opnd::GetKind(pIVar11->m_src2), OVar4 != OpndKindSym)) {
LAB_00547d64:
      pIVar14 = (Instr *)0x0;
    }
    else {
      pOVar10 = pIVar11->m_src2;
      OVar4 = IR::Opnd::GetKind(pOVar10);
      if (OVar4 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar5) goto LAB_00548068;
        *puVar9 = 0;
      }
      pp_Var1 = pOVar10[1]._vptr_Opnd;
      if (*(char *)((long)pp_Var1 + 0x14) != '\x01') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar5) goto LAB_00548068;
        *puVar9 = 0;
      }
      uVar7 = *(uint *)(pp_Var1 + 3);
      uVar12 = uVar7 & 0x100000;
      if ((uVar12 != 0) && (*(short *)((long)pp_Var1 + 0x16) == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
        if (!bVar5) goto LAB_00548068;
        *puVar9 = 0;
        uVar7 = *(uint *)(pp_Var1 + 3);
        uVar12 = uVar7 & 0x100000;
      }
      if (uVar12 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1b8,"(linkSym->IsArgSlotSym())","linkSym->IsArgSlotSym()");
        if (!bVar5) goto LAB_00548068;
        *puVar9 = 0;
        uVar7 = *(uint *)(pp_Var1 + 3);
      }
      if (((((uVar7 & 1) == 0) || (pp_Var1[5] == (_func_int *)0x0)) &&
          (bVar5 = Func::IsInPhase(callInstr->m_func,FGPeepsPhase), !bVar5)) &&
         (bVar5 = Func::IsInPhase(callInstr->m_func,FGBuildPhase), !bVar5)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1bf,
                           "(linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)))"
                           ,
                           "linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase))"
                          );
        if (!bVar5) goto LAB_00548068;
        *puVar9 = 0;
      }
      if (((ulong)pp_Var1[3] & 1) == 0) goto LAB_00547d64;
      pIVar14 = (Instr *)pp_Var1[5];
    }
    opcode = pIVar11->m_opcode;
    if (opcode != ArgOut_A_InlineSpecialized) {
      if (opcode == StartCall) {
        if (pIVar14 != (Instr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar9 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                             ,0x1ce,"(nextArg == nullptr)","nextArg == nullptr");
          if (!bVar5) goto LAB_00548068;
          *puVar9 = 0;
        }
        break;
      }
      this_00 = callInstr->m_func->m_symTable;
      pSVar8 = IR::Opnd::GetStackSym(pIVar11->m_dst);
      argSlotNum = StackSym::GetArgSlotNum(pSVar8);
      pSVar8 = SymTable::GetArgSlotSym(this_00,argSlotNum);
      dstOpnd = IR::SymOpnd::New(&pSVar8->super_Sym,0,pIVar11->m_dst->m_type,callInstr->m_func);
      this_01 = IR::Instr::New(opcode,&dstOpnd->super_Opnd,pIVar11->m_src1,callInstr->m_func);
      IR::Instr::SetByteCodeOffset(this_01,callInstr);
      pSVar8 = IR::Opnd::GetStackSym(this_01->m_dst);
      pSVar8->field_0x1b = pSVar8->field_0x1b | 2;
      pOVar10 = this_01->m_dst;
      if (local_38->m_src2 != (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
        if (!bVar5) goto LAB_00548068;
        *puVar9 = 0;
      }
      pFVar2 = local_38->m_func;
      if (pOVar10->isDeleted == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x14,"(!isDeleted)","Using deleted operand");
        if (!bVar5) goto LAB_00548068;
        *puVar9 = 0;
      }
      bVar6 = pOVar10->field_0xb;
      if ((bVar6 & 2) != 0) {
        pOVar10 = IR::Opnd::Copy(pOVar10,pFVar2);
        bVar6 = pOVar10->field_0xb;
      }
      pOVar10->field_0xb = bVar6 | 2;
      local_38->m_src2 = pOVar10;
      IR::Instr::InsertBefore(local_38,this_01);
      pIVar13 = pIVar11;
      local_38 = this_01;
    }
    pIVar11 = pIVar14;
  } while (pIVar14 != (Instr *)0x0);
  pSVar8 = IR::Opnd::GetStackSym(pIVar13->m_src2);
  if ((pSVar8->field_0x18 & 1) == 0) {
    pIVar11 = (Instr *)0x0;
  }
  else {
    pIVar11 = (pSVar8->field_5).m_instrDef;
  }
  pOVar10 = pIVar11->m_dst;
  if (local_38->m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
    if (!bVar5) goto LAB_00548068;
    *puVar9 = 0;
  }
  pFVar2 = local_38->m_func;
  if (pOVar10->isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar5) {
LAB_00548068:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar9 = 0;
  }
  bVar6 = pOVar10->field_0xb;
  if ((bVar6 & 2) != 0) {
    pOVar10 = IR::Opnd::Copy(pOVar10,pFVar2);
    bVar6 = pOVar10->field_0xb;
  }
  pOVar10->field_0xb = bVar6 | 2;
  local_38->m_src2 = pOVar10;
  return;
}

Assistant:

void Inline::CloneCallSequence(IR::Instr* callInstr, IR::Instr* clonedCallInstr)
{
    IR::Instr* previousArg = nullptr;
    IR::Instr* previousClonedArg = clonedCallInstr;
    callInstr->IterateArgInstrs([&](IR::Instr* argInstr){
        IR::Instr* cloneArg = IR::Instr::New(argInstr->m_opcode,
            IR::SymOpnd::New(callInstr->m_func->m_symTable->GetArgSlotSym(argInstr->GetDst()->GetStackSym()->GetArgSlotNum()), 0, argInstr->GetDst()->GetType(), callInstr->m_func),
            argInstr->GetSrc1(), callInstr->m_func);
        cloneArg->SetByteCodeOffset(callInstr);
        cloneArg->GetDst()->GetStackSym()->m_isArgCaptured = true;
        previousClonedArg->SetSrc2(cloneArg->GetDst());
        previousClonedArg->InsertBefore(cloneArg);
        previousArg = argInstr;
        previousClonedArg = cloneArg;
        return false;
    });
    IR::Instr* startCall = previousArg->GetSrc2()->GetStackSym()->GetInstrDef();
    previousClonedArg->SetSrc2(startCall->GetDst());

}